

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall Matrix::operator*(Matrix *this,Matrix *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  runtime_error *this_00;
  undefined8 *in_RDX;
  double *extraout_RDX;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  Matrix MVar15;
  
  uVar1 = other->rows;
  uVar2 = *(uint *)((long)in_RDX + 0xc);
  uVar7 = (ulong)uVar2;
  this->rows = uVar1;
  this->cols = uVar2;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)(uVar2 * uVar1)) {
    uVar8 = (ulong)(uVar2 * uVar1) * 8;
  }
  pdVar5 = (double *)operator_new__(uVar8);
  this->data = pdVar5;
  uVar3 = other->cols;
  if (uVar3 == *(uint *)(in_RDX + 1)) {
    pdVar6 = extraout_RDX;
    if (0 < (int)uVar1) {
      pdVar4 = other->data;
      pdVar6 = (double *)*in_RDX;
      uVar8 = 0;
      uVar9 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar13 = 0;
          pdVar10 = pdVar6;
          do {
            dVar14 = 0.0;
            if (0 < (int)uVar3) {
              uVar12 = 0;
              pdVar11 = pdVar10;
              do {
                dVar14 = dVar14 + pdVar4[uVar8 + uVar12] * *pdVar11;
                uVar12 = uVar12 + 1;
                pdVar11 = pdVar11 + uVar7;
              } while (uVar3 != uVar12);
            }
            pdVar5[uVar9 * uVar7 + uVar13] = dVar14;
            uVar13 = uVar13 + 1;
            pdVar10 = pdVar10 + 1;
          } while (uVar13 != uVar7);
        }
        uVar9 = uVar9 + 1;
        uVar8 = (ulong)((int)uVar8 + uVar3);
      } while (uVar9 != uVar1);
    }
    MVar15._8_8_ = pdVar6;
    MVar15.data = (double *)this;
    return MVar15;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& other) const
{
    Matrix product = Matrix(rows, other.cols);

    if (cols != other.rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < other.cols; ++j)
        {
            double ij = 0;
            for (int k = 0; k < cols; ++k)
            {
                ij += this->operator()(i, k) * other(k, j);
            }
            product(i, j) = ij;
        }
    }

    return product;
}